

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

GLchar * LoadShader(string *file)

{
  byte bVar1;
  runtime_error *this;
  GLchar *pGVar2;
  undefined1 auVar3 [16];
  GLchar *shaderCode;
  undefined8 local_238;
  long local_220;
  long shaderFileLength;
  ifstream shaderFile;
  string *file_local;
  
  std::ifstream::ifstream((string *)&shaderFileLength);
  std::ifstream::open((string *)&shaderFileLength,(_Ios_Openmode)file);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    std::istream::seekg((long)&shaderFileLength,_S_beg);
    auVar3 = std::istream::tellg();
    local_238 = auVar3._8_8_;
    shaderCode = auVar3._0_8_;
    local_220 = std::fpos::operator_cast_to_long((fpos *)&shaderCode);
    std::istream::seekg((long)&shaderFileLength,_S_beg);
    pGVar2 = (GLchar *)operator_new__(local_220 + 1);
    std::istream::read((char *)&shaderFileLength,(long)pGVar2);
    std::ifstream::close();
    pGVar2[local_220] = '\0';
    std::ifstream::~ifstream(&shaderFileLength);
    return pGVar2;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"COULD NOT FIND SHADER FILE");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

GLchar* LoadShader(const std::string &file) {

  std::ifstream shaderFile;
  long shaderFileLength;

  shaderFile.open(file, std::ios::binary);

  if (shaderFile.fail()) {
    throw std::runtime_error("COULD NOT FIND SHADER FILE");
  }

  shaderFile.seekg(0, shaderFile.end);
  shaderFileLength = shaderFile.tellg();
  shaderFile.seekg(0, shaderFile.beg);

  GLchar *shaderCode = new GLchar[shaderFileLength + 1];
  shaderFile.read(shaderCode, shaderFileLength);

  shaderFile.close();

  shaderCode[shaderFileLength] = '\0';

  return shaderCode;
}